

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planck_unit.c
# Opt level: O3

void planck_unit_destroy_suite(planck_unit_suite_t *suite)

{
  planck_unit_test_t *__ptr;
  
  __ptr = suite->head;
  while (__ptr != (planck_unit_test_t *)0x0) {
    suite->tail = __ptr->next;
    free(__ptr);
    __ptr = suite->tail;
    suite->head = __ptr;
  }
  free(suite);
  return;
}

Assistant:

void
planck_unit_destroy_suite(
	planck_unit_suite_t *suite
) {
	/* We will use the tail pointer to track the next test state to free. */
	while (NULL != suite->head) {
		suite->tail = suite->head->next;
		free(suite->head);
		suite->head = suite->tail;
	}

	free(suite);
}